

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O3

ssize_t __thiscall Pl_TIFFPredictor::write(Pl_TIFFPredictor *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  pointer puVar6;
  
  puVar6 = (pointer)CONCAT44(in_register_00000034,__fd);
  puVar2 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar5 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start +
           (long)(puVar6 + ((ulong)this->bytes_per_row - (long)puVar2));
  puVar4 = puVar6;
  while (puVar3 = puVar5, puVar3 <= (pointer)((long)__buf + (long)puVar6)) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->cur_row,puVar2,puVar4,
               puVar3);
    uVar1 = this->bytes_per_row;
    processRow(this);
    puVar2 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    puVar4 = puVar3;
    puVar5 = puVar3 + uVar1;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->cur_row,puVar2,puVar4,
             (pointer)((long)__buf + (long)puVar6));
  return extraout_RAX;
}

Assistant:

void
Pl_TIFFPredictor::write(unsigned char const* data, size_t len)
{
    auto end = data + len;
    auto row_end = data + (bytes_per_row - cur_row.size());
    while (row_end <= end) {
        // finish off current row
        cur_row.insert(cur_row.end(), data, row_end);
        data = row_end;
        row_end += bytes_per_row;

        processRow();

        // Prepare for next row
        cur_row.clear();
    }

    cur_row.insert(cur_row.end(), data, end);
}